

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

node_type *
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int,_int>_>,_256,_false>_>
::EmptyNode(void)

{
  return (node_type *)&EmptyNode::empty_node;
}

Assistant:

static node_type *EmptyNode() {
#ifdef _MSC_VER
            static EmptyNodeType empty_node;
            // This assert fails on some other construction methods.
            assert(empty_node.parent == &empty_node);
            return &empty_node;
#else
            static constexpr EmptyNodeType empty_node(
                const_cast<EmptyNodeType *>(&empty_node));
            return const_cast<EmptyNodeType *>(&empty_node);
#endif
        }